

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printMemRegImm(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  set_mem_access(MI,true);
  printS16ImmOperand_Mem(MI,OpNo,O);
  SStream_concat0(O,"(");
  op = MCInst_getOperand(MI,OpNo + 1);
  uVar1 = MCOperand_getReg(op);
  if (uVar1 == 0x36) {
    SStream_concat0(O,"0");
  }
  else {
    printOperand(MI,OpNo + 1,O);
  }
  SStream_concat0(O,")");
  set_mem_access(MI,false);
  return;
}

Assistant:

static void printMemRegImm(MCInst *MI, unsigned OpNo, SStream *O)
{
	set_mem_access(MI, true);

	printS16ImmOperand_Mem(MI, OpNo, O);

	SStream_concat0(O, "(");

	if (MCOperand_getReg(MCInst_getOperand(MI, OpNo + 1)) == PPC_R0)
		SStream_concat0(O, "0");
	else
		printOperand(MI, OpNo + 1, O);

	SStream_concat0(O, ")");
	set_mem_access(MI, false);
}